

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeout.c
# Opt level: O2

void run_timers(void)

{
  char *pcVar1;
  uint uVar2;
  timer_element *__ptr;
  void *pvVar3;
  
  while( true ) {
    __ptr = level->lev_timers;
    if ((__ptr == (timer_element *)0x0) || (uVar2 = __ptr->timeout, moves < uVar2)) break;
    level->lev_timers = __ptr->next;
    pvVar3 = __ptr->arg;
    if (__ptr->kind == 2) {
      pcVar1 = (char *)((long)pvVar3 + 0x49);
      *pcVar1 = *pcVar1 + -1;
    }
    (*timeout_funcs[__ptr->func_index].f)(pvVar3,(ulong)uVar2);
    free(__ptr);
  }
  return;
}

Assistant:

void run_timers(void)
{
    timer_element *curr;

    /*
     * Always use the first element.  Elements may be added or deleted at
     * any time.  The list is ordered, we are done when the first element
     * is in the future.
     */
    while (level->lev_timers && level->lev_timers->timeout <= moves) {
	curr = level->lev_timers;
	level->lev_timers = curr->next;

	if (curr->kind == TIMER_OBJECT) ((struct obj *)(curr->arg))->timed--;
	(*timeout_funcs[curr->func_index].f)(curr->arg, curr->timeout);
	free(curr);
    }
}